

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
b_array::
Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~Array(Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this)

{
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar1;
  long lVar2;
  
  pPVar1 = this->data;
  if (pPVar1 != (Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    lVar2 = *(long *)((long)&pPVar1[-1].value.field_2 + 8);
    if (lVar2 != 0) {
      lVar2 = lVar2 * 0x28;
      do {
        std::__cxx11::string::~string((string *)((long)pPVar1 + lVar2 + -0x20));
        lVar2 = lVar2 + -0x28;
      } while (lVar2 != 0);
    }
    operator_delete__((void *)((long)&pPVar1[-1].value.field_2 + 8));
    return;
  }
  return;
}

Assistant:

~Array() { delete[] data; }